

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int lj_cf_io_method_close(lua_State *L)

{
  long lVar1;
  int iVar2;
  IOFileUD *iof;
  
  if (L->base < L->top) {
    iof = io_tofile(L);
  }
  else {
    lVar1 = *(long *)((L->glref).ptr64 + 0x2d0);
    if (*(long *)(lVar1 + 0x30) == 0) {
      lj_err_caller(L,LJ_ERR_IOCLFL);
    }
    iof = (IOFileUD *)(lVar1 + 0x30);
  }
  iVar2 = io_file_close(L,iof);
  return iVar2;
}

Assistant:

LJLIB_CF(io_method_close)
{
  IOFileUD *iof;
  if (L->base < L->top) {
    iof = io_tofile(L);
  } else {
    iof = IOSTDF_IOF(L, GCROOT_IO_OUTPUT);
    if (iof->fp == NULL)
      lj_err_caller(L, LJ_ERR_IOCLFL);
  }
  return io_file_close(L, iof);
}